

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O3

void next_leaves(dna_bwt_t *bwt1,dna_bwt_t *bwt2,sa_leaf *L1,sa_leaf *L2,
                vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
                *TMP_LEAVES,int *t,int min_size)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  pointer ppVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  p_range ext_2;
  p_range ext_1;
  p_range local_b0;
  p_range local_70;
  
  uVar8 = (ulong)min_size;
  dna_bwt<dna_string>::LF(&local_70,bwt1,L1->rn);
  dna_bwt<dna_string>::LF(&local_b0,bwt2,L2->rn);
  *t = 0;
  bVar10 = uVar8 <= ((local_70.A.second - local_70.A.first) - local_b0.A.first) + local_b0.A.second;
  if (bVar10) {
    uVar1 = L1->depth;
    uVar2 = L2->depth;
    *t = 1;
    ppVar6 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (ppVar6->first).rn.first = local_70.A.first;
    (ppVar6->first).rn.second = local_70.A.second;
    (ppVar6->first).depth = uVar1 + 1;
    (ppVar6->second).rn.first = local_b0.A.first;
    (ppVar6->second).rn.second = local_b0.A.second;
    (ppVar6->second).depth = uVar2 + 1;
  }
  uVar5 = (uint)bVar10;
  uVar4 = uVar5;
  if (uVar8 <= ((local_70.C.second - local_70.C.first) - local_b0.C.first) + local_b0.C.second) {
    uVar1 = L1->depth;
    uVar2 = L2->depth;
    uVar4 = uVar5 + 1;
    *t = uVar4;
    ppVar6 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (ulong)(uVar5 * 0x30);
    *(unsigned_long *)((long)&(ppVar6->first).rn.first + uVar7) = local_70.C.first;
    *(unsigned_long *)((long)&(ppVar6->first).rn.second + uVar7) = local_70.C.second;
    *(uint64_t *)((long)&(ppVar6->first).depth + uVar7) = uVar1 + 1;
    *(unsigned_long *)((long)&(ppVar6->second).rn.first + uVar7) = local_b0.C.first;
    *(unsigned_long *)((long)&(ppVar6->second).rn.second + uVar7) = local_b0.C.second;
    *(uint64_t *)((long)&(ppVar6->second).depth + uVar7) = uVar2 + 1;
  }
  uVar5 = uVar4;
  if (uVar8 <= ((local_70.G.second - local_70.G.first) - local_b0.G.first) + local_b0.G.second) {
    uVar1 = L1->depth;
    uVar2 = L2->depth;
    uVar5 = uVar4 + 1;
    *t = uVar5;
    ppVar6 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (ulong)(uVar4 * 0x30);
    *(unsigned_long *)((long)&(ppVar6->first).rn.first + uVar7) = local_70.G.first;
    *(unsigned_long *)((long)&(ppVar6->first).rn.second + uVar7) = local_70.G.second;
    *(uint64_t *)((long)&(ppVar6->first).depth + uVar7) = uVar1 + 1;
    *(unsigned_long *)((long)&(ppVar6->second).rn.first + uVar7) = local_b0.G.first;
    *(unsigned_long *)((long)&(ppVar6->second).rn.second + uVar7) = local_b0.G.second;
    *(uint64_t *)((long)&(ppVar6->second).depth + uVar7) = uVar2 + 1;
  }
  if (((local_70.T.second - local_70.T.first) - local_b0.T.first) + local_b0.T.second < uVar8) {
    if (uVar5 == 0) {
      return;
    }
    ppVar6 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = uVar5;
  }
  else {
    uVar1 = L1->depth;
    uVar2 = L2->depth;
    uVar4 = uVar5 + 1;
    *t = uVar4;
    ppVar6 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (ulong)(uVar5 * 0x30);
    *(unsigned_long *)((long)&(ppVar6->first).rn.first + uVar8) = local_70.T.first;
    *(unsigned_long *)((long)&(ppVar6->first).rn.second + uVar8) = local_70.T.second;
    *(uint64_t *)((long)&(ppVar6->first).depth + uVar8) = uVar1 + 1;
    *(unsigned_long *)((long)&(ppVar6->second).rn.first + uVar8) = local_b0.T.first;
    *(unsigned_long *)((long)&(ppVar6->second).rn.second + uVar8) = local_b0.T.second;
    *(uint64_t *)((long)&(ppVar6->second).depth + uVar8) = uVar2 + 1;
    ppVar6 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  lVar9 = (long)&(ppVar6->first).rn.first + (ulong)(uVar4 * 0x30);
  lVar3 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  std::
  __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<sa_leaf,sa_leaf>*,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<next_leaves(dna_bwt<dna_string>*,dna_bwt<dna_string>*,sa_leaf&,sa_leaf&,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>&,int&,int)::__0>>
            (ppVar6,lVar9,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
  std::
  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<sa_leaf,sa_leaf>*,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>>,__gnu_cxx::__ops::_Iter_comp_iter<next_leaves(dna_bwt<dna_string>*,dna_bwt<dna_string>*,sa_leaf&,sa_leaf&,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>&,int&,int)::__0>>
            (ppVar6,lVar9);
  return;
}

Assistant:

void next_leaves(dna_bwt_t * bwt1, dna_bwt_t * bwt2, sa_leaf & L1, sa_leaf & L2, vector<pair<sa_leaf, sa_leaf> > & TMP_LEAVES, int & t, int min_size){

	p_range ext_1 = bwt1->LF(L1.rn);
	p_range ext_2 = bwt2->LF(L2.rn);

	//push non-empty leaves on stack in decreasing size order

	t = 0;

	if(range_length(ext_1.A) + range_length(ext_2.A) >= min_size) TMP_LEAVES[t++] = {{ext_1.A, L1.depth+1},{ext_2.A, L2.depth+1}};
	if(range_length(ext_1.C) + range_length(ext_2.C) >= min_size) TMP_LEAVES[t++] = {{ext_1.C, L1.depth+1},{ext_2.C, L2.depth+1}};
	if(range_length(ext_1.G) + range_length(ext_2.G) >= min_size) TMP_LEAVES[t++] = {{ext_1.G, L1.depth+1},{ext_2.G, L2.depth+1}};
	if(range_length(ext_1.T) + range_length(ext_2.T) >= min_size) TMP_LEAVES[t++] = {{ext_1.T, L1.depth+1},{ext_2.T, L2.depth+1}};

	std::sort( TMP_LEAVES.begin(), TMP_LEAVES.begin()+t, [ ]( const pair<sa_leaf, sa_leaf>& lhs, const pair<sa_leaf, sa_leaf>& rhs )
	{
		return leaf_size(lhs) < leaf_size(rhs);
	});

}